

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_long> *out)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  RepeatedField<unsigned_long> *in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  unsigned_long *dst;
  int block_size;
  int old_entries;
  int num;
  unsigned_long *dst_1;
  int block_size_1;
  int old_entries_1;
  int num_1;
  int nbytes;
  int in_stack_000000ac;
  RepeatedField<unsigned_long> *in_stack_000000b0;
  int local_2c;
  int local_1c;
  void *local_18;
  char *local_8;
  
  local_2c = ((int)*(undefined8 *)(in_RDI + 8) + 0x10) - (int)in_RSI;
  local_1c = in_EDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_1c <= local_2c) {
      RepeatedField<unsigned_long>::size(in_RCX);
      RepeatedField<unsigned_long>::Reserve(in_stack_000000b0,in_stack_000000ac);
      iVar2 = (int)((ulong)(long)local_1c >> 3) << 3;
      puVar4 = RepeatedField<unsigned_long>::AddNAlreadyReserved(_old_entries,block_size);
      memcpy(puVar4,local_18,(long)iVar2);
      local_8 = (char *)((long)local_18 + (long)iVar2);
      if (local_1c != iVar2) {
        local_8 = (char *)0x0;
      }
      return local_8;
    }
    iVar2 = (int)((ulong)(long)local_2c >> 3);
    RepeatedField<unsigned_long>::size(in_RCX);
    RepeatedField<unsigned_long>::Reserve(in_stack_000000b0,in_stack_000000ac);
    iVar3 = iVar2 * 8;
    puVar4 = RepeatedField<unsigned_long>::AddNAlreadyReserved(_old_entries,block_size);
    memcpy(puVar4,local_18,(long)iVar3);
    local_18 = (void *)((long)local_18 + (long)iVar3);
    local_1c = local_1c + iVar2 * -8;
    bVar1 = DoneWithCheck((EpsCopyInputStream *)dst_1,(char **)_old_entries,block_size);
    if (bVar1) break;
    local_2c = ((int)*(undefined8 *)(in_RDI + 8) + 0x10) - (int)local_18;
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  int nbytes = buffer_end_ + kSlopBytes - ptr;
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    ptr += block_size;
    size -= block_size;
    if (DoneWithCheck(&ptr, -1)) return nullptr;
    nbytes = buffer_end_ + kSlopBytes - ptr;
  }
  int num = size / sizeof(T);
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  int block_size = num * sizeof(T);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef PROTOBUF_LITTLE_ENDIAN
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}